

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::set_double_val(char *ext,double val)

{
  char *__s;
  ushort uVar1;
  byte bVar2;
  ulong uVar3;
  double dVar4;
  double __x;
  
  uVar1 = *(ushort *)ext;
  dVar4 = -val;
  __x = dVar4;
  if (dVar4 <= val) {
    __x = val;
  }
  ext[4] = ext[4] & 0xf8U | val < dVar4;
  __s = ext + 5;
  memset(__s,0,(ulong)(uVar1 + 1 >> 1));
  dVar4 = log10(__x);
  *(short *)(ext + 2) = (short)(int)dVar4 + 1;
  dVar4 = pow(10.0,(double)(int)dVar4);
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      bVar2 = (byte)uVar3 & 1;
      __s[uVar3 >> 1] =
           (byte)(((int)(__x / dVar4) & 0xfU) << (bVar2 * '\x04' ^ 4)) |
           '\x0f' << (bVar2 << 2) & __s[uVar3 >> 1];
      __x = __x - (double)(int)(__x / dVar4) * dVar4;
      uVar3 = uVar3 + 1;
      dVar4 = dVar4 / 10.0;
    } while (uVar1 != uVar3);
  }
  normalize(ext);
  return;
}

Assistant:

void CVmObjBigNum::set_double_val(char *ext, double val)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* set the sign bit */
    if (val < 0)
    {
        set_neg(ext, TRUE);
        val = -val;
    }
    else
        set_neg(ext, FALSE);

    /* zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* 
     *   Initialize our exponent 'exp' to the integer portion of log10(val).
     *   If val is a power of 10, exp == log10(val) is an integer, and val is
     *   exactly one times 10^exp (e.g., if val is 1000, log10(val) == 3.0,
     *   and val == 1*10^3).  If val isn't a power of 10, 10^exp is the
     *   nearest power of 10 below val.  For example, log10(1500) == 3.176,
     *   so exp == int(log10(1500)) == 3, so val = 1.5*10^3.  In other words,
     *   the value can be represented as some number between 1 and 10 times
     *   10^exp.  Our storage format is close to this: we store the mantissa
     *   as a value between 0 and 1.  So what we *really* want for the
     *   exponent is log10(val)+1 - this will give us an exponent that we can
     *   multiply by some number between 0 and 1 to recreate 'val'.  
     */
    int exp = (int)log10(val) + 1;
    set_exp(ext, exp);

    /* 
     *   We know that val divided by 10^exp is between 0 and 1.  So the most
     *   significant digit of val is val/10^(exp-1).  We can then divide the
     *   remainder of that calculation by 10^(exp-2) to get the next digit,
     *   and the remainder of that by 10^(exp-3) for the next digit, and so
     *   on.  Keep going until we've filled out our digits.
     */
    double base = pow(10.0, exp - 1);
    for (size_t i = 0 ; i < prec ; ++i, base /= 10.0)
    {
        /* 
         *   get the most significant remaining digit by dividing by the
         *   log10 exponent of the current value 
         */
        int dig = (int)(val / base);
        set_dig(ext, i, dig);

        /* get the remainder */
        val -= dig*base;
    }

    /* normalize the number */
    normalize(ext);
}